

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eq_Pos_Table.cpp
# Opt level: O1

vector<Position,_std::allocator<Position>_> * __thiscall
Eq_Pos_Table::get_equivalent_positions
          (vector<Position,_std::allocator<Position>_> *__return_storage_ptr__,Eq_Pos_Table *this,
          Color center_color,int flat_entry)

{
  vector<Position,_std::allocator<Position>_> *extraout_RAX;
  
  switch(center_color) {
  case green:
    this = (Eq_Pos_Table *)&this->green_eq;
    break;
  case blue:
    break;
  case yellow:
    this = (Eq_Pos_Table *)&this->yellow_eq;
    break;
  case red:
    this = (Eq_Pos_Table *)&this->red_eq;
    break;
  default:
    get_equivalent_positions();
    (__return_storage_ptr__->super__Vector_base<Position,_std::allocator<Position>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Position,_std::allocator<Position>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Position,_std::allocator<Position>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Position,std::allocator<Position>>::_M_range_initialize<Position_const*>();
    return extraout_RAX;
  }
  std::vector<Position,_std::allocator<Position>_>::vector
            (__return_storage_ptr__,
             (this->blue_eq).
             super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + flat_entry);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Position> Eq_Pos_Table::get_equivalent_positions(Color center_color, int flat_entry){
    switch (center_color)
    {
    case Color::blue:
        return blue_eq[flat_entry];
        break;
    case Color::yellow:
        return yellow_eq[flat_entry];
        break;
    case Color::red:
        return red_eq[flat_entry];
        break;
    case Color::green:
        return green_eq[flat_entry];
        break;
    default:
        printf("Invalid color\n");
        break;
    }
}